

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ImplicationConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplicationConstraintSyntax,slang::syntax::ImplicationConstraintSyntax_const&>
          (BumpAllocator *this,ImplicationConstraintSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  ExpressionSyntax *pEVar3;
  Info *pIVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  ImplicationConstraintSyntax *pIVar10;
  
  pIVar10 = (ImplicationConstraintSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ImplicationConstraintSyntax *)this->endPtr < pIVar10 + 1) {
    pIVar10 = (ImplicationConstraintSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pIVar10 + 1);
  }
  (pIVar10->constraints).ptr = (args->constraints).ptr;
  SVar8 = (args->super_ConstraintItemSyntax).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args->super_ConstraintItemSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ConstraintItemSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_ConstraintItemSyntax).super_SyntaxNode.previewNode;
  pEVar3 = (args->left).ptr;
  uVar5 = (args->arrow).field_0x2;
  NVar6.raw = (args->arrow).numFlags.raw;
  uVar7 = (args->arrow).rawLen;
  pIVar4 = (args->arrow).info;
  (pIVar10->arrow).kind = (args->arrow).kind;
  (pIVar10->arrow).field_0x2 = uVar5;
  (pIVar10->arrow).numFlags = (NumericTokenFlags)NVar6.raw;
  (pIVar10->arrow).rawLen = uVar7;
  (pIVar10->arrow).info = pIVar4;
  (pIVar10->super_ConstraintItemSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pIVar10->left).ptr = pEVar3;
  (pIVar10->super_ConstraintItemSyntax).super_SyntaxNode.kind = SVar8;
  *(undefined4 *)&(pIVar10->super_ConstraintItemSyntax).super_SyntaxNode.field_0x4 = uVar9;
  (pIVar10->super_ConstraintItemSyntax).super_SyntaxNode.parent = pSVar1;
  return pIVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }